

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,char32_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,int count,char32_t *value)

{
  value_type_conflict4 *__value;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> *this;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> local_38;
  int local_2c;
  char32_t *pcStack_28;
  int i;
  char32_t *value_local;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bStack_18;
  int count_local;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out_local;
  
  pcStack_28 = value;
  value_local._4_4_ = count;
  bStack_18.container = out.container;
  for (local_2c = 0; __value = pcStack_28, local_2c < value_local._4_4_; local_2c = local_2c + 1) {
    local_38 = std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>::operator++
                         (&stack0xffffffffffffffe8,0);
    this = std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>::operator*(&local_38);
    std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>::operator=(this,__value);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bStack_18.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}